

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar9 = (window->Scroll).x;
  fVar4 = (window->Scroll).y;
  fVar8 = (window->ScrollTarget).x;
  if (fVar8 < 3.4028235e+38) {
    fVar9 = (window->ScrollbarSizes).x;
    fVar2 = (window->ScrollTargetCenterRatio).x;
    fVar5 = (window->ScrollTargetEdgeSnapDist).x;
    if (fVar5 <= 0.0) {
      fVar10 = (window->SizeFull).x;
    }
    else {
      fVar10 = (window->SizeFull).x;
      if (fVar8 <= fVar5) {
        fVar8 = fVar8 * fVar2 + 0.0;
      }
      else {
        fVar11 = ((window->ScrollMax).x + fVar10) - fVar9;
        if (fVar11 - fVar5 <= fVar8) {
          fVar8 = fVar8 + (fVar11 - fVar8) * fVar2;
        }
      }
    }
    fVar9 = fVar8 - fVar2 * (fVar10 - fVar9);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar8 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar5 = fVar4 + fVar8 + (window->ScrollbarSizes).y;
    fVar4 = (window->ScrollTarget).y;
    fVar8 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (fVar2 <= 0.0) {
      fVar10 = (window->SizeFull).y;
    }
    else {
      fVar10 = (window->SizeFull).y;
      if (fVar4 <= fVar2) {
        fVar4 = fVar4 * fVar8 + 0.0;
      }
      else {
        fVar11 = ((window->ScrollMax).y + fVar10) - fVar5;
        if (fVar11 - fVar2 <= fVar4) {
          fVar4 = fVar4 + (fVar11 - fVar4) * fVar8;
        }
      }
    }
    fVar4 = fVar4 - fVar8 * (fVar10 - fVar5);
  }
  IVar6.x = (float)(int)(float)(-(uint)(0.0 <= fVar9) & (uint)fVar9);
  IVar6.y = (float)(int)(float)(-(uint)(0.0 <= fVar4) & (uint)fVar4);
  auVar7._8_8_ = 0;
  auVar7._0_4_ = IVar6.x;
  auVar7._4_4_ = IVar6.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar3._8_8_ = 0;
    auVar3._0_4_ = (window->ScrollMax).x;
    auVar3._4_4_ = (window->ScrollMax).y;
    auVar7 = minps(auVar7,auVar3);
    IVar6 = auVar7._0_8_;
  }
  return IVar6;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float decoration_total_width = window->ScrollbarSizes.x;
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
        {
            float snap_x_min = 0.0f;
            float snap_x_max = window->ScrollMax.x + window->SizeFull.x - decoration_total_width;
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        }
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - decoration_total_width);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_total_height = window->TitleBarHeight() + window->MenuBarHeight() + window->ScrollbarSizes.y;
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
        {
            float snap_y_min = 0.0f;
            float snap_y_max = window->ScrollMax.y + window->SizeFull.y - decoration_total_height;
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        }
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - decoration_total_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}